

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

QStringList * dirsList(QStringList *__return_storage_ptr__,QString *xdgEnvVar)

{
  long in_FS_OFFSET;
  iterator __begin1;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char16_t> local_b0;
  QStringView local_98;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QStringView,_QChar> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  local_50.m_haystack.m_data = (xdgEnvVar->d).ptr;
  local_50.m_haystack.m_size = (xdgEnvVar->d).size;
  local_50.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_50.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_50.m_needle.ucs = L':';
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_88,&local_50);
  while (local_88[0x18] != false) {
    local_98.m_size = local_88._8_8_;
    local_98.m_data = (storage_type_conflict *)local_88._16_8_;
    if (((undefined1 *)local_88._8_8_ != (undefined1 *)0x0) &&
       (*(storage_type_conflict *)local_88._16_8_ == L'/')) {
      QStringView::toString((QString *)&QStack_c8,&local_98);
      QDir::cleanPath((QString *)&local_b0,(QString *)&QStack_c8);
      QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
    }
    QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_88);
  }
  QtPrivate::QStringList_removeDuplicates(__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList dirsList(const QString &xdgEnvVar)
{
    QStringList dirs;
    // http://standards.freedesktop.org/basedir-spec/latest/
    // Normalize paths, skip relative paths (the spec says relative paths
    // should be ignored)
    for (const auto dir : qTokenize(xdgEnvVar, u':'))
        if (dir.startsWith(u'/'))
            dirs.push_back(QDir::cleanPath(dir.toString()));

    // Remove duplicates from the list, there's no use for duplicated paths
    // in XDG_* env vars - if whatever is being looked for is not found in
    // the given directory the first time, it won't be there the second time.
    // Plus duplicate paths causes problems for example for mimetypes,
    // where duplicate paths here lead to duplicated mime types returned
    // for a file, eg "text/plain,text/plain" instead of "text/plain"
    dirs.removeDuplicates();

    return dirs;
}